

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

int template_find_field(t_template *x,t_symbol *name,int *p_onset,int *p_type,t_symbol **p_arraytype
                       )

{
  t_symbol **pptVar1;
  long lVar2;
  
  if (x == (t_template *)0x0) {
    bug("template_find_field");
  }
  else if (0 < (long)x->t_n) {
    pptVar1 = &x->t_vec->ds_arraytemplate;
    lVar2 = 0;
    do {
      if (pptVar1[-1] == name) {
        *p_onset = (int)lVar2;
        *p_type = ((t_dataslot *)(pptVar1 + -2))->ds_type;
        *p_arraytype = *pptVar1;
        return 1;
      }
      pptVar1 = pptVar1 + 3;
      lVar2 = lVar2 + 8;
    } while ((long)x->t_n * 8 != lVar2);
  }
  return 0;
}

Assistant:

int template_find_field(t_template *x, t_symbol *name, int *p_onset,
    int *p_type, t_symbol **p_arraytype)
{
    t_template *t;
    int i, n;
    if (!x)
    {
        bug("template_find_field");
        return (0);
    }
    n = x->t_n;
    for (i = 0; i < n; i++)
        if (x->t_vec[i].ds_name == name)
    {
        *p_onset = i * sizeof(t_word);
        *p_type = x->t_vec[i].ds_type;
        *p_arraytype = x->t_vec[i].ds_arraytemplate;
        return (1);
    }
    return (0);
}